

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

char * fmt::v8::detail::
       parse_precision<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::specs_handler<char>_> *handler)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *local_58;
  precision_adapter local_50;
  undefined1 local_48 [40];
  
  local_58 = begin + 1;
  if (local_58 == end) {
    iVar2 = 0;
  }
  else {
    iVar2 = (int)*local_58;
  }
  if (iVar2 - 0x30U < 10) {
    iVar2 = parse_nonnegative_int<char>(&local_58,end,-1);
    if (iVar2 == -1) {
      throw_format_error("number is too big");
    }
    ((handler->super_specs_handler<char>).super_specs_setter<char>.specs_)->precision = iVar2;
  }
  else {
    if (iVar2 != 0x7b) {
      throw_format_error("missing precision specifier");
    }
    pcVar3 = begin + 2;
    local_58 = pcVar3;
    if (pcVar3 != end) {
      local_50.handler = handler;
      if ((*pcVar3 == ':') || (*pcVar3 == '}')) {
        specs_handler<char>::get_arg(local_48,&handler->super_specs_handler<char>);
        iVar2 = get_dynamic_spec<fmt::v8::detail::precision_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,char>>,fmt::v8::detail::error_handler>
                          ();
        ((handler->super_specs_handler<char>).super_specs_setter<char>.specs_)->precision = iVar2;
        local_58 = pcVar3;
      }
      else {
        local_58 = do_parse_arg_id<char,fmt::v8::detail::parse_precision<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>(char_const*,char_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&)::precision_adapter&>
                             (pcVar3,end,&local_50);
      }
    }
    if ((local_58 == end) ||
       (pcVar3 = local_58 + 1, cVar1 = *local_58, local_58 = pcVar3, cVar1 != '}')) {
      throw_format_error("invalid format string");
    }
  }
  if ((handler->arg_type_ < custom_type) && ((0x41feU >> (handler->arg_type_ & 0x1f) & 1) != 0)) {
    throw_format_error("precision not allowed for this argument type");
  }
  return local_58;
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}